

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int fits_rebin_wcs(fitsfile *fptr,int naxis,float *amin,float *binsize,int *status)

{
  ulong uVar1;
  ulong uVar2;
  double binsized [4];
  double amind [4];
  double local_48 [4];
  double local_28 [4];
  
  if (*status == 0) {
    if (0 < naxis) {
      uVar1 = 4;
      if (naxis < 4) {
        uVar1 = (ulong)(uint)naxis;
      }
      uVar2 = 0;
      do {
        local_28[uVar2] = (double)amin[uVar2];
        local_48[uVar2] = (double)binsize[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    fits_rebin_wcsd(fptr,naxis,local_28,local_48,status);
  }
  return *status;
}

Assistant:

int fits_rebin_wcs(
      fitsfile *fptr,   /* I - pointer to table to be binned           */
      int naxis,        /* I - number of axes in the histogram image   */
      float *amin,     /* I - first pixel include in each axis        */
      float *binsize,  /* I - binning factor for each axis            */
      int *status)      
{
  double amind[4], binsized[4];

  /* Copy single precision values into double precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amind[i] = (double) amin[i];
      binsized[i] = (double) binsize[i];
    }

    fits_rebin_wcsd(fptr, naxis, amind, binsized, status);
  }


  return (*status);
}